

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg)

{
  size_t in_R9;
  string_view data;
  string_view format_00;
  string result;
  char *local_48;
  size_t local_40;
  char local_38;
  undefined7 uStack_37;
  size_type local_28;
  pointer local_20;
  
  format_00._M_len = format._M_str;
  local_20 = (arg->_M_dataplus)._M_p;
  local_28 = arg->_M_string_length;
  local_40 = 0;
  local_38 = '\0';
  format_00._M_str = (char *)&local_28;
  local_48 = &local_38;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_48,(Nonnull<std::string_*>)format._M_len,format_00,
             (Nullable<const_absl::string_view_*>)0x1,in_R9);
  data._M_str = local_48;
  data._M_len = local_40;
  Write(this,data);
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }